

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O0

void my_reflection_example(void)

{
  ChValue *pCVar1;
  bool bVar2;
  int iVar3;
  ChStreamOutAscii *pCVar4;
  vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> *pvVar5;
  reference ppCVar6;
  char *pcVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ChValue *i2;
  iterator __end2;
  iterator __begin2;
  vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> *__range2;
  string local_790;
  undefined1 local_770 [8];
  vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> props2;
  ChArchiveExplorer mexplorer2;
  ChValue *i;
  iterator __end1;
  iterator __begin1;
  vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> *__range1;
  string local_5a0;
  undefined1 local_580 [8];
  vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> props;
  string local_560;
  allocator local_539;
  string local_538;
  allocator local_511;
  string local_510;
  undefined1 local_4f0 [8];
  myEmployee a_employee;
  string local_4a8;
  myEmployee local_488;
  myEmployeeBoss local_448;
  allocator local_3b9;
  string local_3b8;
  myEmployee local_398;
  undefined1 local_358 [8];
  vector<myEmployee,_std::allocator<myEmployee>_> mcontainer;
  string local_338;
  int local_318;
  allocator local_311;
  int my_foo;
  int local_2f0;
  allocator local_2e9;
  int my_age;
  allocator local_2c1;
  string local_2c0;
  undefined1 local_2a0 [8];
  myEmployee my_slave;
  string local_258;
  double local_238;
  double my_wages;
  myEmployeeBoss m_boss;
  undefined1 local_198 [8];
  ChArchiveExplorer mexplorer;
  
  chrono::ChArchiveExplorer::ChArchiveExplorer((ChArchiveExplorer *)local_198);
  chrono::ChArchiveExplorer::SetUseWildcards((ChArchiveExplorer *)local_198,true);
  chrono::ChArchiveExplorer::SetUseUserNames((ChArchiveExplorer *)local_198,true);
  myEmployeeBoss::myEmployeeBoss((myEmployeeBoss *)&my_wages,0x47,42000.4,true);
  m_boss.super_myEmployee.wages._0_4_ = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_258,"wages",(allocator *)(my_slave.name.field_2._M_local_buf + 0xf));
  bVar2 = chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,double>
                    ((ChArchiveExplorer *)local_198,&local_238,(myEmployeeBoss *)&my_wages,
                     &local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)(my_slave.name.field_2._M_local_buf + 0xf));
  if (bVar2) {
    pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar4 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar4,"Property explorer : retrieved \'wages\'=")
    ;
    pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,local_238);
    chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  }
  else {
    pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar4,"Property explorer : cannot retrieve \'wages\'! \n")
    ;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,"John",&local_2c1);
  myEmployee::myEmployee((myEmployee *)local_2a0,0x12,1020.3,ATHLETIC,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&my_age,"slave",&local_2e9);
  bVar2 = chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,myEmployee>
                    ((ChArchiveExplorer *)local_198,(myEmployee *)local_2a0,
                     (myEmployeeBoss *)&my_wages,(string *)&my_age);
  std::__cxx11::string::~string((string *)&my_age);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  if (bVar2) {
    pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar4 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar4,"Property explorer : retrieved \'slave\'=\n");
    pCVar4 = chrono::operator<<(pCVar4,(myEmployee *)local_2a0);
    chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  }
  else {
    pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar4,"Property explorer : cannot retrieve \'slave\'! \n")
    ;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&my_foo,"s?*e/age",&local_311);
  bVar2 = chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,int>
                    ((ChArchiveExplorer *)local_198,&local_2f0,(myEmployeeBoss *)&my_wages,
                     (string *)&my_foo);
  std::__cxx11::string::~string((string *)&my_foo);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  if (bVar2) {
    pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar4 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar4,"Property explorer : retrieved \'slave/age\'=");
    pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,local_2f0);
    chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  }
  else {
    pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar4,"Property explorer : cannot retrieve \'slave/age\'! \n");
  }
  local_318 = 0x7b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_338,"foo",
             (allocator *)
             ((long)&mcontainer.super__Vector_base<myEmployee,_std::allocator<myEmployee>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,int>
                    ((ChArchiveExplorer *)local_198,&local_318,(myEmployeeBoss *)&my_wages,
                     &local_338);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&mcontainer.super__Vector_base<myEmployee,_std::allocator<myEmployee>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  if (bVar2) {
    pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar4 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar4,"Property explorer : retrieved \'int foo\'=");
    pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,local_318);
    chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  }
  else {
    pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar4,"Property explorer : cannot retrieve \'int foo\'! \n");
  }
  std::vector<myEmployee,_std::allocator<myEmployee>_>::vector
            ((vector<myEmployee,_std::allocator<myEmployee>_> *)local_358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3b8,"Josh",&local_3b9);
  myEmployee::myEmployee(&local_398,0x13,4000.0,ATHLETIC,&local_3b8);
  std::vector<myEmployee,_std::allocator<myEmployee>_>::push_back
            ((vector<myEmployee,_std::allocator<myEmployee>_> *)local_358,&local_398);
  myEmployee::~myEmployee(&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  myEmployeeBoss::myEmployeeBoss(&local_448,0x1d,5000.0,true);
  std::vector<myEmployee,_std::allocator<myEmployee>_>::push_back
            ((vector<myEmployee,_std::allocator<myEmployee>_> *)local_358,
             &local_448.super_myEmployee);
  myEmployeeBoss::~myEmployeeBoss(&local_448);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4a8,"Marie",(allocator *)(a_employee.name.field_2._M_local_buf + 0xf))
  ;
  myEmployee::myEmployee(&local_488,0x1f,6000.0,ATHLETIC,&local_4a8);
  std::vector<myEmployee,_std::allocator<myEmployee>_>::push_back
            ((vector<myEmployee,_std::allocator<myEmployee>_> *)local_358,&local_488);
  myEmployee::~myEmployee(&local_488);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)(a_employee.name.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_510,"John",&local_511);
  myEmployee::myEmployee((myEmployee *)local_4f0,0x12,1020.3,ATHLETIC,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_538,"1",&local_539);
  bVar2 = chrono::ChArchiveExplorer::
          FetchValue<std::vector<myEmployee,std::allocator<myEmployee>>,myEmployee>
                    ((ChArchiveExplorer *)local_198,(myEmployee *)local_4f0,
                     (vector<myEmployee,_std::allocator<myEmployee>_> *)local_358,&local_538);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  if (bVar2) {
    pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar4 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar4,
                        "Property explorer : retrieved from element number in container \'1\' =\n");
    pCVar4 = chrono::operator<<(pCVar4,(myEmployee *)local_4f0);
    chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  }
  else {
    pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar4,"Property explorer : cannot retrieve from element number! \n");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_560,"\'Marie\'",
             (allocator *)
             ((long)&props.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = chrono::ChArchiveExplorer::
          FetchValue<std::vector<myEmployee,std::allocator<myEmployee>>,myEmployee>
                    ((ChArchiveExplorer *)local_198,(myEmployee *)local_4f0,
                     (vector<myEmployee,_std::allocator<myEmployee>_> *)local_358,&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&props.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (bVar2) {
    pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar4 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar4,
                        "Property explorer : retrieved from element container name \'Marie\' =\n");
    pCVar4 = chrono::operator<<(pCVar4,(myEmployee *)local_4f0);
    chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  }
  else {
    pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar4,"Property explorer : cannot retrieve from element container name! \n");
  }
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar4,"This has sub properties? : ");
  bVar2 = chrono::ChArchiveExplorer::IsObject<std::vector<myEmployee,std::allocator<myEmployee>>>
                    ((ChArchiveExplorer *)local_198,
                     (vector<myEmployee,_std::allocator<myEmployee>_> *)local_358);
  pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,bVar2);
  chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar4,"This has sub properties? : ");
  bVar2 = chrono::ChArchiveExplorer::IsObject<int>((ChArchiveExplorer *)local_198,&local_2f0);
  pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,bVar2);
  chrono::ChStreamOutAscii::operator<<(pCVar4,"\n\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar4,"List of fetched properties in std::vector of employees: \n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5a0,"*",(allocator *)((long)&__range1 + 7));
  pvVar5 = chrono::ChArchiveExplorer::
           FetchValues<std::vector<myEmployee,std::allocator<myEmployee>>>
                     ((ChArchiveExplorer *)local_198,
                      (vector<myEmployee,_std::allocator<myEmployee>_> *)local_358,&local_5a0);
  std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::vector
            ((vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> *)local_580,pvVar5);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  __end1 = std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::begin
                     ((vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> *)local_580);
  i = (ChValue *)
      std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::end
                ((vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> *)local_580);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<chrono::ChValue_**,_std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>_>
                                *)&i);
    if (!bVar2) break;
    ppCVar6 = __gnu_cxx::
              __normal_iterator<chrono::ChValue_**,_std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>_>
              ::operator*(&__end1);
    pCVar1 = *ppCVar6;
    pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4," val: ");
    pcVar7 = chrono::ChValue::name(pCVar1);
    pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,pcVar7);
    pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,",  reg.class: ");
    iVar3 = (*pCVar1->_vptr_ChValue[3])();
    pCVar4 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar4,(string *)CONCAT44(extraout_var,iVar3));
    pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,",  typeid: ");
    iVar3 = (*pCVar1->_vptr_ChValue[5])();
    pCVar4 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar4,(char *)CONCAT44(extraout_var_00,iVar3));
    chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
    chrono::ChArchiveExplorer::ChArchiveExplorer
              ((ChArchiveExplorer *)
               &props2.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_790,"*",(allocator *)((long)&__range2 + 7));
    pvVar5 = chrono::ChArchiveExplorer::FetchValues
                       ((ChArchiveExplorer *)
                        &props2.
                         super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,pCVar1,&local_790);
    std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::vector
              ((vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> *)local_770,pvVar5);
    std::__cxx11::string::~string((string *)&local_790);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __end2 = std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::begin
                       ((vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> *)local_770);
    i2 = (ChValue *)
         std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::end
                   ((vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> *)local_770);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<chrono::ChValue_**,_std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>_>
                                  *)&i2);
      if (!bVar2) break;
      ppCVar6 = __gnu_cxx::
                __normal_iterator<chrono::ChValue_**,_std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>_>
                ::operator*(&__end2);
      pCVar1 = *ppCVar6;
      pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
      pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,"    val: ");
      pcVar7 = chrono::ChValue::name(pCVar1);
      pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,pcVar7);
      pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,",  reg.class: ");
      iVar3 = (*pCVar1->_vptr_ChValue[3])();
      pCVar4 = (ChStreamOutAscii *)
               chrono::ChStreamOutAscii::operator<<
                         (pCVar4,(string *)CONCAT44(extraout_var_01,iVar3));
      pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,",  typeid: ");
      iVar3 = (*pCVar1->_vptr_ChValue[5])();
      pCVar4 = (ChStreamOutAscii *)
               chrono::ChStreamOutAscii::operator<<(pCVar4,(char *)CONCAT44(extraout_var_02,iVar3));
      chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
      __gnu_cxx::
      __normal_iterator<chrono::ChValue_**,_std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::~vector
              ((vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> *)local_770);
    chrono::ChArchiveExplorer::~ChArchiveExplorer
              ((ChArchiveExplorer *)
               &props2.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<chrono::ChValue_**,_std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::~vector
            ((vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> *)local_580);
  myEmployee::~myEmployee((myEmployee *)local_4f0);
  std::vector<myEmployee,_std::allocator<myEmployee>_>::~vector
            ((vector<myEmployee,_std::allocator<myEmployee>_> *)local_358);
  myEmployee::~myEmployee((myEmployee *)local_2a0);
  myEmployeeBoss::~myEmployeeBoss((myEmployeeBoss *)&my_wages);
  chrono::ChArchiveExplorer::~ChArchiveExplorer((ChArchiveExplorer *)local_198);
  return;
}

Assistant:

void my_reflection_example()
{
    ChArchiveExplorer mexplorer;
    mexplorer.SetUseWildcards(true);
    mexplorer.SetUseUserNames(true);

    myEmployeeBoss m_boss(71, 42000.4, true);
    m_boss.body = FAT;

    double my_wages;
    if (mexplorer.FetchValue(my_wages, m_boss, "wages"))
        GetLog() << "Property explorer : retrieved 'wages'=" << my_wages << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve 'wages'! \n";

    myEmployee my_slave;
    if (mexplorer.FetchValue(my_slave, m_boss, "slave"))
        GetLog() << "Property explorer : retrieved 'slave'=\n" << my_slave << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve 'slave'! \n";

    int my_age;
    if (mexplorer.FetchValue(my_age, m_boss, "s?*e/age"))
        GetLog() << "Property explorer : retrieved 'slave/age'=" << my_age << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve 'slave/age'! \n";

    int my_foo = 123;
    if (mexplorer.FetchValue(my_foo, m_boss, "foo"))
        GetLog() << "Property explorer : retrieved 'int foo'=" << my_foo << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve 'int foo'! \n";

    // Test access to containers (std::vector, arrays, etc.). Elements can
    // be fetched using two approaches: integer indexes or menmonic names.
    std::vector<myEmployee> mcontainer;
    mcontainer.push_back(myEmployee(19,4000,ATHLETIC, "Josh"));
    mcontainer.push_back(myEmployeeBoss(29,5000, "Jeff"));
    mcontainer.push_back(myEmployee(31,6000,ATHLETIC, "Marie"));
    myEmployee a_employee;

    // Method A: just use the index in the search string, 
    //   ex: "stuff/arrayofpositions/6/x" as in:

    if (mexplorer.FetchValue(a_employee, mcontainer, "1"))
        GetLog() << "Property explorer : retrieved from element number in container '1' =\n" << a_employee << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve from element number! \n";

    // Method B: if you deal if working with objects that implement 
    // ArchiveContainerName(), you can use the name between single quotation marks '...',
    //   ex: "stuff/arrayofbodies/'Crank'/mass" as in:
    if (mexplorer.FetchValue(a_employee, mcontainer, "'Marie'"))
        GetLog() << "Property explorer : retrieved from element container name 'Marie' =\n" << a_employee << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve from element container name! \n";

    // Test if some object can be explored
    GetLog() << "This has sub properties? : " << mexplorer.IsObject(mcontainer) << "\n";
    GetLog() << "This has sub properties? : " << mexplorer.IsObject(my_age) << "\n\n";

    // Fetch all subproperties of an object using "*"
    GetLog() << "List of fetched properties in std::vector of employees: \n";
    auto props = mexplorer.FetchValues(mcontainer, "*");
    for (auto i : props) {
        GetLog() << " val: " << i->name() << ",  reg.class: " << i->GetClassRegisteredName() << ",  typeid: " << i->GetTypeidName() << "\n";
        //if (auto pi = dynamic_cast<myEmployeeBoss*>(i->PointerUpCast<myEmployee>()))
        //    GetLog() <<"   castable to myEmployeeBoss \n";
        ChArchiveExplorer mexplorer2;
        auto props2 = mexplorer2.FetchValues(*i, "*");
        for (auto i2 : props2) {
            GetLog() << "    val: " << i2->name() << ",  reg.class: " << i2->GetClassRegisteredName() << ",  typeid: " << i2->GetTypeidName() << "\n";
        }
    }
}